

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::CloneDebugInlinedAt
          (DebugInfoManager *this,uint32_t clone_inlined_at_id,Instruction *insert_before)

{
  IRContext *pIVar1;
  PodType PVar2;
  Instruction *pIVar3;
  pointer *__ptr;
  string message;
  size_type __dnew;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  spv_position_t local_48;
  
  pIVar3 = GetDebugInlinedAt(this,clone_inlined_at_id);
  if (pIVar3 == (Instruction *)0x0) {
    return (Instruction *)0x0;
  }
  pIVar3 = Instruction::Clone(pIVar3,this->context_);
  pIVar1 = this->context_;
  local_78._M_head_impl = pIVar3;
  PVar2.data._M_elems =
       (array<signed_char,_4UL>)
       Module::TakeNextIdBound
                 ((pIVar1->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((PVar2.data._M_elems == (_Type)0x0) &&
     ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_48.line._0_4_ = (array<signed_char,_4UL>)0x25;
    local_48.line._4_4_ = (array<signed_char,_4UL>)0x0;
    local_70._0_8_ = local_70 + 0x10;
    local_70._0_8_ = std::__cxx11::string::_M_create((ulong *)local_70,(ulong)&local_48);
    local_70._16_8_ = local_48.line;
    *(undefined8 *)local_70._0_8_ = 0x667265766f204449;
    *(undefined8 *)(local_70._0_8_ + 8) = 0x797254202e776f6c;
    *(undefined8 *)(local_70._0_8_ + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)(local_70._0_8_ + 0x18) = 0x746361706d6f6320;
    builtin_strncpy((char *)(local_70._0_8_ + 0x1d),"act-ids.",8);
    local_70._8_8_ = local_48.line;
    *(char *)(local_70._0_8_ + local_48.line) = '\0';
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_70._0_8_);
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (pIVar3->has_result_id_ != false) {
LAB_001f24d7:
      __assert_fail("res_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
  }
  else if (pIVar3->has_result_id_ != false) {
    if (PVar2.data._M_elems != (_Type)0x0) {
      local_70._24_8_ = local_70 + 0x10;
      local_70._0_8_ = &PTR__SmallVector_003d7c78;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_70._16_4_ = PVar2.data._M_elems;
      local_70._8_8_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)&((OperandData *)
                         ((((pIVar3->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                         _vptr_SmallVector + (ulong)((uint)pIVar3->has_type_id_ * 0x30)),
                 (SmallVector<unsigned_int,_2UL> *)local_70);
      local_70._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      RegisterDbgInst(this,pIVar3);
      if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        DefUseManager::AnalyzeInstDefUse
                  ((this->context_->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar3);
      }
      if (insert_before == (Instruction *)0x0) {
        insert_before =
             &(((this->context_->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
              ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
      }
      pIVar3 = Instruction::InsertBefore
                         (insert_before,
                          (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           *)&local_78);
      if (local_78._M_head_impl == (Instruction *)0x0) {
        return pIVar3;
      }
      (*((local_78._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
      return pIVar3;
    }
    goto LAB_001f24d7;
  }
  __assert_fail("has_result_id_",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
}

Assistant:

Instruction* DebugInfoManager::CloneDebugInlinedAt(uint32_t clone_inlined_at_id,
                                                   Instruction* insert_before) {
  auto* inlined_at = GetDebugInlinedAt(clone_inlined_at_id);
  if (inlined_at == nullptr) return nullptr;
  std::unique_ptr<Instruction> new_inlined_at(inlined_at->Clone(context()));
  new_inlined_at->SetResultId(context()->TakeNextId());
  RegisterDbgInst(new_inlined_at.get());
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(new_inlined_at.get());
  if (insert_before != nullptr)
    return insert_before->InsertBefore(std::move(new_inlined_at));
  return context()->module()->ext_inst_debuginfo_end()->InsertBefore(
      std::move(new_inlined_at));
}